

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_template.cpp
# Opt level: O3

TemplateDecls * __thiscall
pfederc::Parser::parseTemplateDecl(TemplateDecls *__return_storage_ptr__,Parser *this)

{
  Lexer *pLVar1;
  Token *pTVar2;
  pointer pcVar3;
  istream *piVar4;
  __uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
  *p_Var5;
  Lexer *pLVar6;
  bool bVar7;
  bool bVar8;
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  *pvVar9;
  pointer *__ptr;
  BiOpExpr *biopexpr;
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  *pvVar10;
  _Head_base<0UL,_pfederc::TemplateDecl_*,_false> local_78;
  Lexer *local_70;
  Lexer *local_68;
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  *local_60;
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  local_58;
  
  local_60 = __return_storage_ptr__;
  sanityExpect(this,TOK_OP_TEMPL_BRACKET_OPEN);
  bVar8 = false;
  parseExpression((Parser *)&local_70,(Precedence)this);
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_70 != (Lexer *)0x0) {
    bVar8 = false;
    do {
      pLVar6 = local_70;
      if (*(int *)&(local_70->filePath)._M_dataplus._M_p != 0x12) break;
      if ((((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
             *)&local_70->_vptr_Lexer)->
          super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          )._M_t.
          super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>._M_head_impl !=
          (Error<pfederc::SyntaxErrorCode> *)&PTR__BiOpExpr_00127990) {
        __cxa_bad_cast();
      }
      if ((short)(local_70->fileContent)._M_string_length != 0x2e) break;
      local_78._M_head_impl = *(TemplateDecl **)((long)&(local_70->fileContent).field_2 + 8);
      *(undefined8 *)((long)&(local_70->fileContent).field_2 + 8) = 0;
      fromExprToTemplateDecl
                ((Parser *)&local_68,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
      if (local_68 == (Lexer *)0x0) {
        bVar8 = true;
      }
      else {
        std::
        vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
        ::_M_insert_rval(&local_58,
                         (const_iterator)
                         local_58.
                         super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_68);
      }
      pLVar1 = (Lexer *)(pLVar6->fileContent).field_2._M_allocated_capacity;
      (pLVar6->fileContent).field_2._M_allocated_capacity = 0;
      if (local_70 != (Lexer *)0x0) {
        p_Var5 = (__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                  *)&local_70->_vptr_Lexer;
        local_70 = pLVar1;
        (*(code *)(((p_Var5->
                    super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                    .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>.
                   _M_head_impl)->pos).line)();
        pLVar1 = local_70;
      }
      local_70 = pLVar1;
      if (local_68 != (Lexer *)0x0) {
        std::default_delete<pfederc::TemplateDecl>::operator()
                  ((default_delete<pfederc::TemplateDecl> *)&local_68,(TemplateDecl *)local_68);
      }
      if ((Lexer *)local_78._M_head_impl != (Lexer *)0x0) {
        (*(code *)*(Expr **)((long)&(((local_78._M_head_impl)->id)._M_t.
                                     super___uniq_ptr_impl<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::TokenExpr_*,_std::default_delete<pfederc::TokenExpr>_>
                                     .super__Head_base<0UL,_pfederc::TokenExpr_*,_false>.
                                    _M_head_impl)->super_Expr + 8))();
      }
    } while (local_70 != (Lexer *)0x0);
  }
  fromExprToTemplateDecl
            ((Parser *)&local_78,
             (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
  if ((Lexer *)local_78._M_head_impl == (Lexer *)0x0) {
    bVar8 = expect(this,TOK_TEMPL_BRACKET_CLOSE);
    pvVar9 = local_60;
    pvVar10 = local_60;
    if (bVar8) goto LAB_00116d21;
  }
  else {
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::_M_insert_rval(&local_58,
                     (const_iterator)
                     local_58.
                     super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_78);
    pvVar10 = local_60;
    bVar7 = expect(this,TOK_TEMPL_BRACKET_CLOSE);
    pvVar9 = pvVar10;
    if (bVar7) {
      if (!bVar8) {
        (pvVar10->
        super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start =
             local_58.
             super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pvVar10->
        super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pvVar10->
        super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_58.
             super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar9 = &local_58;
      }
      goto LAB_00116d21;
    }
  }
  pTVar2 = this->lexer->currentToken;
  local_68 = (Lexer *)operator_new(0x38);
  pcVar3 = (pointer)(pTVar2->pos).endIndex;
  *(Level *)&local_68->_vptr_Lexer = LVL_ERROR;
  *(SyntaxErrorCode *)((long)&local_68->_vptr_Lexer + 4) = STX_ERR_EXPECTED_TEMPL_CLOSING_BRACKET;
  piVar4 = (istream *)(pTVar2->pos).startIndex;
  ((Position *)&local_68->cfg)->line = (pTVar2->pos).line;
  local_68->input = piVar4;
  (local_68->filePath)._M_dataplus._M_p = pcVar3;
  (local_68->filePath)._M_string_length = 0;
  (local_68->filePath).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(local_68->filePath).field_2 + 8) = 0;
  generateError((Parser *)&stack0xffffffffffffffc8,
                (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                 *)this);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
             &stack0xffffffffffffffc8);
  pvVar10 = pvVar9;
  if (local_68 != (Lexer *)0x0) {
    std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_68,
               (Error<pfederc::SyntaxErrorCode> *)local_68);
  }
LAB_00116d21:
  (pvVar9->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar9->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar9->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((Lexer *)local_78._M_head_impl != (Lexer *)0x0) {
    std::default_delete<pfederc::TemplateDecl>::operator()
              ((default_delete<pfederc::TemplateDecl> *)&local_78,local_78._M_head_impl);
  }
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::~vector(&local_58);
  if (local_70 != (Lexer *)0x0) {
    (*(code *)(((((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                   *)&local_70->_vptr_Lexer)->
                super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                )._M_t.
                super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>.
               _M_head_impl)->pos).line)();
  }
  return pvVar10;
}

Assistant:

TemplateDecls Parser::parseTemplateDecl() noexcept {
  sanityExpect(TokenType::TOK_OP_TEMPL_BRACKET_OPEN);

  bool err = false;

  std::unique_ptr<Expr> expr(parseExpression());
  TemplateDecls result;

  while (expr && isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    std::unique_ptr<Expr> rhs(biopexpr.getRightPtr());

    std::unique_ptr<TemplateDecl> templdecl(fromExprToTemplateDecl(std::move(rhs)));
    if (!templdecl)
      err = true;
    else
      // success, push on result
      result.insert(result.begin(), std::move(templdecl));

    // next iterator step
    expr = biopexpr.getLeftPtr();
  }
  
  std::unique_ptr<TemplateDecl> templdecl(fromExprToTemplateDecl(std::move(expr)));
  if (!templdecl)
    err = true;
  // success, push on result
  else
    result.insert(result.begin(), std::move(templdecl));

  if (!expect(TokenType::TOK_TEMPL_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_TEMPL_CLOSING_BRACKET,
          lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  if (err)
    return TemplateDecls();

  return result;
}